

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation-pipe.cpp
# Opt level: O0

void invalid_inst(void)

{
  bool bVar1;
  bool cont;
  
  printf("Invalid Instruction!");
  do {
    bVar1 = parse_dbg_cmd();
  } while (!bVar1);
  exit(0);
}

Assistant:

void invalid_inst(){
    printf("Invalid Instruction!");
    while(true){
        bool cont = parse_dbg_cmd();
        if(cont)
            break;
    }
    exit(0);
}